

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O0

Gia_ManSwi_t * Gia_ManSwiCreate(Gia_Man_t *pAig,Gia_ParSwi_t *pPars)

{
  int iVar1;
  int iVar2;
  Gia_ManSwi_t *__s;
  Gia_Man_t *pGVar3;
  uint *puVar4;
  int *piVar5;
  Gia_ManSwi_t *p;
  Gia_ParSwi_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  __s = (Gia_ManSwi_t *)malloc(0x38);
  memset(__s,0,0x38);
  pGVar3 = Gia_ManFront(pAig);
  __s->pAig = pGVar3;
  __s->pPars = pPars;
  __s->nWords = pPars->nWords;
  puVar4 = (uint *)malloc((long)(__s->nWords * __s->pAig->nFront) << 2);
  __s->pDataSim = puVar4;
  iVar2 = __s->nWords;
  iVar1 = Gia_ManCiNum(__s->pAig);
  puVar4 = (uint *)malloc((long)(iVar2 * iVar1) << 2);
  __s->pDataSimCis = puVar4;
  iVar2 = __s->nWords;
  iVar1 = Gia_ManCoNum(__s->pAig);
  puVar4 = (uint *)malloc((long)(iVar2 * iVar1) << 2);
  __s->pDataSimCos = puVar4;
  iVar2 = Gia_ManObjNum(pAig);
  piVar5 = (int *)calloc((long)iVar2,4);
  __s->pData1 = piVar5;
  return __s;
}

Assistant:

Gia_ManSwi_t * Gia_ManSwiCreate( Gia_Man_t * pAig, Gia_ParSwi_t * pPars )
{
    Gia_ManSwi_t * p;
    p = ABC_ALLOC( Gia_ManSwi_t, 1 );
    memset( p, 0, sizeof(Gia_ManSwi_t) );
    p->pAig   = Gia_ManFront( pAig );
    p->pPars  = pPars;
    p->nWords = pPars->nWords;
    p->pDataSim = ABC_ALLOC( unsigned, p->nWords * p->pAig->nFront );
    p->pDataSimCis = ABC_ALLOC( unsigned, p->nWords * Gia_ManCiNum(p->pAig) );
    p->pDataSimCos = ABC_ALLOC( unsigned, p->nWords * Gia_ManCoNum(p->pAig) );
    p->pData1 = ABC_CALLOC( int, Gia_ManObjNum(pAig) );
    return p;
}